

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

int coda_strappend(string *out,char *fmt,...)

{
  long lVar1;
  char in_AL;
  uint uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  char *__s;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 uStack_8100;
  char local_80f8 [32768];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  va_list ap;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  ap[0]._0_8_ = &stack0x00000008;
  local_48 = 0x3000000010;
  __s = local_80f8;
  uStack_8100 = 0x1061a2;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  ap[0].overflow_arg_area = local_f8;
  uVar2 = vsnprintf(__s,0x8000,fmt,&local_48);
  if (0x7fff < (int)uVar2) {
    lVar1 = -((ulong)uVar2 + 0x10 & 0xfffffffffffffff0);
    __s = local_80f8 + lVar1;
    ap[0]._0_8_ = &stack0x00000008;
    local_48 = 0x3000000010;
    *(undefined8 *)((long)&uStack_8100 + lVar1) = 0x1061ec;
    ap[0].overflow_arg_area = local_f8;
    vsnprintf(__s,(ulong)uVar2 + 1,fmt,&local_48);
  }
  __s[-8] = -6;
  __s[-7] = 'a';
  __s[-6] = '\x10';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::append((char *)out,(ulong)__s);
  return uVar2;
}

Assistant:

int coda_strappend(std::string& out, const char* fmt, ...)
{
	va_list ap;

	char *BUF = (char *) alloca(BUFSZ);
	va_start(ap, fmt);
	int bytes = vsnprintf(BUF, BUFSZ, fmt, ap);
	va_end(ap);

	if (BUFSZ <= bytes)
	{
		BUF = (char *) alloca(bytes + 1);
		va_start(ap, fmt);
		vsnprintf(BUF, bytes + 1, fmt, ap);
		va_end(ap);
	}

	out.append(BUF, bytes);

	return bytes;
}